

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O2

uint32 __thiscall osc::ReceivedMessageArgument::AsMidiMessage(ReceivedMessageArgument *this)

{
  uint32 uVar1;
  undefined8 *puVar2;
  pointer_____offset_0x10___ *ppuVar3;
  
  if (this->typeTagPtr_ == (char *)0x0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    puVar2[1] = "missing argument";
    *puVar2 = &PTR__exception_0019fc98;
    ppuVar3 = &MissingArgumentException::typeinfo;
  }
  else {
    if (*this->typeTagPtr_ == 'm') {
      uVar1 = AsMidiMessageUnchecked(this);
      return uVar1;
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    puVar2[1] = "wrong argument type";
    *puVar2 = &PTR__exception_0019fcc0;
    ppuVar3 = &WrongArgumentTypeException::typeinfo;
  }
  __cxa_throw(puVar2,ppuVar3,std::exception::~exception);
}

Assistant:

uint32 ReceivedMessageArgument::AsMidiMessage() const
{
    if( !typeTagPtr_ )
        throw MissingArgumentException();
	else if( *typeTagPtr_ == MIDI_MESSAGE_TYPE_TAG )
		return AsMidiMessageUnchecked();
	else
		throw WrongArgumentTypeException();
}